

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_symbolic_unary(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  code *action;
  char *name;
  
  iVar7 = G->pos;
  iVar6 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar5 = G->pos;
  iVar1 = G->thunkpos;
  iVar3 = yymatchChar(G,0x2b);
  if (iVar3 == 0) {
LAB_00112fe4:
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x2d);
    if (iVar3 != 0) {
      iVar3 = G->pos;
      iVar2 = G->thunkpos;
      iVar4 = yymatchChar(G,0x2d);
      if (iVar4 == 0) {
        G->pos = iVar3;
        G->thunkpos = iVar2;
        yy__(G);
        iVar3 = yy_exponentiation_expr(G);
        if (iVar3 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar7 = G->begin;
          iVar6 = G->end;
          action = yy_2_symbolic_unary;
          name = "yy_2_symbolic_unary";
          goto LAB_001132ab;
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x21);
    if (iVar3 != 0) {
      yy__(G);
      iVar3 = yy_symbolic_unary(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_3_symbolic_unary;
        name = "yy_3_symbolic_unary";
        goto LAB_001132ab;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchString(G,"+^");
    if (iVar3 != 0) {
      yy__(G);
      iVar3 = yy_exponentiation_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_4_symbolic_unary;
        name = "yy_4_symbolic_unary";
        goto LAB_001132ab;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x7e);
    if (iVar3 != 0) {
      yy__(G);
      iVar3 = yy_exponentiation_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_5_symbolic_unary;
        name = "yy_5_symbolic_unary";
        goto LAB_001132ab;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x3f);
    if (iVar3 != 0) {
      yy__(G);
      iVar3 = yy_exponentiation_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_6_symbolic_unary;
        name = "yy_6_symbolic_unary";
        goto LAB_001132ab;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x5e);
    if (iVar3 != 0) {
      yy__(G);
      iVar3 = yy_exponentiation_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_7_symbolic_unary;
        name = "yy_7_symbolic_unary";
        goto LAB_001132ab;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x7c);
    if (iVar3 != 0) {
      iVar3 = G->pos;
      iVar2 = G->thunkpos;
      iVar4 = yymatchChar(G,0x7c);
      if (iVar4 == 0) {
        G->pos = iVar3;
        G->thunkpos = iVar2;
        yy__(G);
        iVar3 = yy_exponentiation_expr(G);
        if (iVar3 != 0) {
          yyDo(G,yySet,-1,0,"yySet");
          iVar7 = G->begin;
          iVar6 = G->end;
          action = yy_8_symbolic_unary;
          name = "yy_8_symbolic_unary";
          goto LAB_001132ab;
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar5 = yy_exponentiation_expr(G);
    if (iVar5 == 0) {
      G->pos = iVar7;
      G->thunkpos = iVar6;
      return 0;
    }
  }
  else {
    iVar3 = G->pos;
    iVar2 = G->thunkpos;
    iVar4 = yymatchChar(G,0x5e);
    if (iVar4 != 0) goto LAB_00112fe4;
    G->pos = iVar3;
    G->thunkpos = iVar2;
    yy__(G);
    iVar3 = yy_exponentiation_expr(G);
    if (iVar3 == 0) goto LAB_00112fe4;
    yyDo(G,yySet,-1,0,"yySet");
    iVar7 = G->begin;
    iVar6 = G->end;
    action = yy_1_symbolic_unary;
    name = "yy_1_symbolic_unary";
LAB_001132ab:
    yyDo(G,action,iVar7,iVar6,name);
  }
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_symbolic_unary(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "symbolic_unary"));

  {  int yypos545= G->pos, yythunkpos545= G->thunkpos;  if (!yymatchChar(G, '+')) goto l546;

  {  int yypos547= G->pos, yythunkpos547= G->thunkpos;  if (!yymatchChar(G, '^')) goto l547;
  goto l546;
  l547:;	  G->pos= yypos547; G->thunkpos= yythunkpos547;
  }  if (!yy__(G))  goto l546;
  if (!yy_exponentiation_expr(G))  goto l546;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_symbolic_unary, G->begin, G->end, "yy_1_symbolic_unary");
  goto l545;
  l546:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '-')) goto l548;

  {  int yypos549= G->pos, yythunkpos549= G->thunkpos;  if (!yymatchChar(G, '-')) goto l549;
  goto l548;
  l549:;	  G->pos= yypos549; G->thunkpos= yythunkpos549;
  }  if (!yy__(G))  goto l548;
  if (!yy_exponentiation_expr(G))  goto l548;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_symbolic_unary, G->begin, G->end, "yy_2_symbolic_unary");
  goto l545;
  l548:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '!')) goto l550;
  if (!yy__(G))  goto l550;
  if (!yy_symbolic_unary(G))  goto l550;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_symbolic_unary, G->begin, G->end, "yy_3_symbolic_unary");
  goto l545;
  l550:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchString(G, "+^")) goto l551;
  if (!yy__(G))  goto l551;
  if (!yy_exponentiation_expr(G))  goto l551;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_symbolic_unary, G->begin, G->end, "yy_4_symbolic_unary");
  goto l545;
  l551:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '~')) goto l552;
  if (!yy__(G))  goto l552;
  if (!yy_exponentiation_expr(G))  goto l552;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_symbolic_unary, G->begin, G->end, "yy_5_symbolic_unary");
  goto l545;
  l552:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '?')) goto l553;
  if (!yy__(G))  goto l553;
  if (!yy_exponentiation_expr(G))  goto l553;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_6_symbolic_unary, G->begin, G->end, "yy_6_symbolic_unary");
  goto l545;
  l553:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '^')) goto l554;
  if (!yy__(G))  goto l554;
  if (!yy_exponentiation_expr(G))  goto l554;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_7_symbolic_unary, G->begin, G->end, "yy_7_symbolic_unary");
  goto l545;
  l554:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yymatchChar(G, '|')) goto l555;

  {  int yypos556= G->pos, yythunkpos556= G->thunkpos;  if (!yymatchChar(G, '|')) goto l556;
  goto l555;
  l556:;	  G->pos= yypos556; G->thunkpos= yythunkpos556;
  }  if (!yy__(G))  goto l555;
  if (!yy_exponentiation_expr(G))  goto l555;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_8_symbolic_unary, G->begin, G->end, "yy_8_symbolic_unary");
  goto l545;
  l555:;	  G->pos= yypos545; G->thunkpos= yythunkpos545;  if (!yy_exponentiation_expr(G))  goto l544;

  }
  l545:;	  yyprintf((stderr, "  ok   symbolic_unary"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l544:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "symbolic_unary"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}